

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

void __thiscall CLIntercept::CLIntercept(CLIntercept *this,void *pGlobalData)

{
  _Rb_tree_header *p_Var1;
  SConfig *this_00;
  __pid_t _Var2;
  mapped_type *__s;
  key_type local_38;
  
  *(undefined1 (*) [16])((long)&(this->m_Mutex).super___mutex_base._M_mutex + 0x10) =
       (undefined1  [16])0x0;
  *(undefined1 (*) [16])&(this->m_Mutex).super___mutex_base._M_mutex = (undefined1  [16])0x0;
  (this->m_Mutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  OS::Services::Services(&this->m_OS,pGlobalData);
  (this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header;
  (this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  CEnumNameMap::CEnumNameMap(&this->m_EnumNameMap);
  memset(&this->m_ObjectTracker,0,0x100);
  std::ofstream::ofstream(&this->m_InterceptLog);
  CChromeTracer::CChromeTracer(&this->m_ChromeTrace);
  (this->m_StartTime).__d.__r = 0;
  p_Var1 = &(this->m_ThreadNumberMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_ThreadNumberMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_ThreadNumberMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_ThreadNumberMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_ThreadNumberMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_ThreadNumberMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_SubDeviceCacheMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_SubDeviceCacheMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_SubDeviceCacheMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_SubDeviceCacheMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_SubDeviceCacheMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_SubDeviceCacheMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_SubDeviceInfoMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_SubDeviceInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_SubDeviceInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->m_SubDeviceInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_SubDeviceInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_SubDeviceInfoMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_ProgramInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_ProgramInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->m_ProgramInfoMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_ProgramInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->m_ProgramInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_ProgramInfoMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_HostTimingStatsMap)._M_h._M_buckets = &(this->m_HostTimingStatsMap)._M_h._M_single_bucket
  ;
  (this->m_HostTimingStatsMap)._M_h._M_bucket_count = 1;
  (this->m_HostTimingStatsMap)._M_h._M_before_begin = (_Hash_node_base *)0x0;
  (this->m_HostTimingStatsMap)._M_h._M_element_count = 0;
  (this->m_HostTimingStatsMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined1 (*) [16])&(this->m_HostTimingStatsMap)._M_h._M_rehash_policy._M_next_resize =
       (undefined1  [16])0x0;
  p_Var1 = &(this->m_DeviceInfoMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_DeviceInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_DeviceInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_DeviceInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_DeviceInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->m_DeviceInfoMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_DeviceTimingStatsMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_DeviceTimingStatsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_DeviceTimingStatsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_DeviceTimingStatsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_DeviceTimingStatsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_DeviceTimingStatsMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_KernelInfoMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_KernelInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_KernelInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_KernelInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_KernelInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->m_KernelInfoMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_LongKernelNameMap)._M_h._M_buckets = &(this->m_LongKernelNameMap)._M_h._M_single_bucket;
  (this->m_LongKernelNameMap)._M_h._M_bucket_count = 1;
  (this->m_LongKernelNameMap)._M_h._M_before_begin = (_Hash_node_base *)0x0;
  (this->m_LongKernelNameMap)._M_h._M_element_count = 0;
  (this->m_LongKernelNameMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined1 (*) [16])&(this->m_LongKernelNameMap)._M_h._M_rehash_policy._M_next_resize =
       (undefined1  [16])0x0;
  (this->m_EventList).
  super__List_base<CLIntercept::SEventListNode,_std::allocator<CLIntercept::SEventListNode>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->m_EventList;
  (this->m_EventList).
  super__List_base<CLIntercept::SEventListNode,_std::allocator<CLIntercept::SEventListNode>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->m_EventList;
  (this->m_EventList).
  super__List_base<CLIntercept::SEventListNode,_std::allocator<CLIntercept::SEventListNode>_>.
  _M_impl._M_node._M_size = 0;
  (this->m_MetricAggregations)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_MetricAggregations)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  p_Var1 = &(this->m_MetricAggregations)._M_t._M_impl.super__Rb_tree_header;
  (this->m_MetricAggregations)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_MetricAggregations)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_MetricAggregations)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::ofstream::ofstream(&this->m_MetricDump);
  p_Var1 = &(this->m_QueueNumberMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_QueueNumberMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_QueueNumberMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_QueueNumberMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->m_QueueNumberMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_QueueNumberMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_ContextQueuesMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_ContextQueuesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_ContextQueuesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->m_ContextQueuesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_ContextQueuesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_ContextQueuesMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_EventIdMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_EventIdMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_EventIdMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_EventIdMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_EventIdMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_EventIdMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_MemAllocNumberMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_MemAllocNumberMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_MemAllocNumberMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_MemAllocNumberMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_MemAllocNumberMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_MemAllocNumberMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_SamplerDataMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_SamplerDataMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_SamplerDataMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_SamplerDataMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->m_SamplerDataMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_SamplerDataMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_BufferInfoMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_BufferInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_BufferInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_BufferInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_BufferInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->m_BufferInfoMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_SVMAllocInfoMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_SVMAllocInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_SVMAllocInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_SVMAllocInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_SVMAllocInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_SVMAllocInfoMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_USMAllocInfoMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_USMAllocInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_USMAllocInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_USMAllocInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_USMAllocInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_USMAllocInfoMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_ImageInfoMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_ImageInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_ImageInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_ImageInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_ImageInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_ImageInfoMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_KernelArgMemMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_KernelArgMemMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_KernelArgMemMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_KernelArgMemMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_KernelArgMemMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_KernelArgMemMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_KernelArgSamplerMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_KernelArgSamplerMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_KernelArgSamplerMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_KernelArgSamplerMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_KernelArgSamplerMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_KernelArgSamplerMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_KernelArgDataMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_KernelArgDataMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_KernelArgDataMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->m_KernelArgDataMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_KernelArgDataMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_KernelArgDataMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_KernelArgLocalSizeMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_KernelArgLocalSizeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_KernelArgLocalSizeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_KernelArgLocalSizeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_KernelArgLocalSizeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_KernelArgLocalSizeMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_SourceStringMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_SourceStringMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_SourceStringMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_SourceStringMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_SourceStringMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_SourceStringMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_MapPointerInfoMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_MapPointerInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_MapPointerInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_MapPointerInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_MapPointerInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_MapPointerInfoMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_CaptureReplaySet)._M_t._M_impl.super__Rb_tree_header;
  (this->m_CaptureReplaySet)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_CaptureReplaySet)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->m_CaptureReplaySet)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_CaptureReplaySet)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_CaptureReplaySet)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_AubCaptureSet)._M_t._M_impl.super__Rb_tree_header;
  (this->m_AubCaptureSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_AubCaptureSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_AubCaptureSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_AubCaptureSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->m_AubCaptureSet)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_ContextCallbackInfoMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_ContextCallbackInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_ContextCallbackInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_ContextCallbackInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_ContextCallbackInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_ContextCallbackInfoMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_PrecompiledKernelOverridesMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_PrecompiledKernelOverridesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->m_PrecompiledKernelOverridesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_PrecompiledKernelOverridesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_PrecompiledKernelOverridesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_PrecompiledKernelOverridesMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_BuiltinKernelOverridesMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_BuiltinKernelOverridesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red
  ;
  (this->m_BuiltinKernelOverridesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_BuiltinKernelOverridesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_BuiltinKernelOverridesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_BuiltinKernelOverridesMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_AcceleratorInfoMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_AcceleratorInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_AcceleratorInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_AcceleratorInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_AcceleratorInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_AcceleratorInfoMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_SemaphoreInfoMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_SemaphoreInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_SemaphoreInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->m_SemaphoreInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_SemaphoreInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_SemaphoreInfoMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_CommandBufferInfoMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_CommandBufferInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_CommandBufferInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_CommandBufferInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_CommandBufferInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_CommandBufferInfoMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_CommandBufferRecordMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_CommandBufferRecordMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_CommandBufferRecordMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_CommandBufferRecordMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_CommandBufferRecordMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_CommandBufferRecordMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_MutableCommandInfoMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_MutableCommandInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_MutableCommandInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_MutableCommandInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_MutableCommandInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_MutableCommandInfoMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_CommandBufferMutableCommandsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->m_CommandBufferMutableCommandsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  p_Var1 = &(this->m_CommandBufferMutableCommandsMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_CommandBufferMutableCommandsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_CommandBufferMutableCommandsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_CommandBufferMutableCommandsMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this_00 = &this->m_Config;
  SConfig::SConfig(this_00);
  p_Var1 = &(this->m_USMContextInfoMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_USMContextInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_USMContextInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_USMContextInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_USMContextInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_USMContextInfoMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_USMKernelInfoMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_USMKernelInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_USMKernelInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->m_USMKernelInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_USMKernelInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_USMKernelInfoMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  _Var2 = getpid();
  this->m_ProcessId = (long)_Var2;
  memset(&this->m_Dispatch,0,0x4a8);
  local_38 = (key_type)0x0;
  __s = std::
        map<_cl_platform_id_*,_CLdispatchX,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
        ::operator[](&this->m_DispatchX,&local_38);
  memset(__s,0,0x210);
  this->m_OpenCLLibraryHandle = (void *)0x0;
  this->m_LoggedCLInfo = false;
  (this->m_EnqueueCounter).super___atomic_base<unsigned_long>._M_i = 0;
  this->m_EventsChromeTraced = 0;
  this->m_ProgramNumber = 0;
  this->m_KernelID = 0;
  this->m_pMDHelper = (MDHelper *)0x0;
  this->m_QueueNumber = 0;
  this->m_MemAllocNumber = 0;
  this->m_CaptureReplayKernelEnqueueSkipCounter = 0;
  this->m_CaptureReplayKernelEnqueueCaptureCounter = 0;
  this->m_AubCaptureStarted = false;
  this->m_AubCaptureKernelEnqueueSkipCounter = 0;
  this->m_AubCaptureKernelEnqueueCaptureCounter = 0;
  this->m_CommandBufferNumber = 0;
  (this->m_Config).ITTCallLogging = false;
  this_00->SuppressLogging = false;
  this_00->AppendFiles = false;
  this_00->LogToFile = false;
  this_00->LogToDebugger = false;
  this_00->LogIndent = 0;
  this_00->BuildLogging = false;
  this_00->PreferredWorkGroupSizeMultipleLogging = false;
  this_00->KernelInfoLogging = false;
  this_00->CallLogging = false;
  this_00->CallLoggingEnqueueCounter = false;
  this_00->CallLoggingThreadId = false;
  this_00->CallLoggingThreadNumber = false;
  this_00->CallLoggingElapsedTime = false;
  (this->m_Config).ChromeTraceBufferSize = 0x4000;
  (this->m_Config).ChromeTraceBufferingBlockingCallFlush = true;
  (this->m_Config).ChromeCallLogging = false;
  (this->m_Config).ChromeFlowEvents = false;
  (this->m_Config).ErrorLogging = false;
  (this->m_Config).ErrorAssert = false;
  (this->m_Config).ContextCallbackLogging = false;
  (this->m_Config).ContextHintLevel = 0;
  (this->m_Config).EventCallbackLogging = false;
  (this->m_Config).QueueInfoLogging = false;
  (this->m_Config).EventChecking = false;
  (this->m_Config).LeakChecking = false;
  (this->m_Config).LeakChecking = false;
  (this->m_Config).USMChecking = false;
  (this->m_Config).CLInfoLogging = false;
  (this->m_Config).FlushFiles = false;
  std::__cxx11::string::assign((char *)&(this->m_Config).DumpDir);
  (this->m_Config).AppendPid = false;
  (this->m_Config).UniqueFiles = false;
  (this->m_Config).KernelNameHashTracking = false;
  (this->m_Config).LongKernelNameCutoff = 0xffffffff;
  (this->m_Config).DemangleKernelNames = false;
  (this->m_Config).ReportToStderr = false;
  (this->m_Config).ReportToFile = true;
  (this->m_Config).ReportInterval = 0;
  (this->m_Config).HostPerformanceTiming = false;
  (this->m_Config).ToolOverheadTiming = true;
  (this->m_Config).HostPerformanceTimingMinEnqueue = 0;
  (this->m_Config).DevicePerformanceTiming = false;
  (this->m_Config).DevicePerformanceTimeKernelInfoTracking = false;
  (this->m_Config).DevicePerformanceTimeGWOTracking = false;
  (this->m_Config).DevicePerformanceTimeGWSTracking = false;
  (this->m_Config).DevicePerformanceTimeLWSTracking = false;
  (this->m_Config).DevicePerformanceTimeSuggestedLWSTracking = false;
  (this->m_Config).DevicePerformanceTimeTransferTracking = false;
  (this->m_Config).DevicePerformanceTimingSkipUnmap = false;
  (this->m_Config).HostPerformanceTimingMaxEnqueue = 0xffffffff;
  (this->m_Config).DevicePerformanceTimingMinEnqueue = 0;
  (this->m_Config).DevicePerformanceTimingMaxEnqueue = 0xffffffff;
  (this->m_Config).HostPerformanceTimeLogging = false;
  (this->m_Config).DevicePerformanceTimeLogging = false;
  (this->m_Config).DevicePerformanceTimelineLogging = false;
  std::__cxx11::string::assign((char *)&(this->m_Config).DevicePerfCounterLibName);
  (this->m_Config).DevicePerfCounterEventBasedSampling = false;
  (this->m_Config).DevicePerfCounterTimeBasedSampling = false;
  (this->m_Config).DevicePerfCounterAdapterIndex = 0;
  std::__cxx11::string::assign((char *)&(this->m_Config).DevicePerfCounterCustom);
  std::__cxx11::string::assign((char *)&(this->m_Config).DevicePerfCounterFile);
  (this->m_Config).DevicePerfCounterTiming = false;
  (this->m_Config).DevicePerfCounterReportMax = false;
  (this->m_Config).DevicePerfCounterTimeBasedSamplingPeriod = 1000;
  (this->m_Config).DevicePerfCounterTimeBasedBufferSize = 0;
  (this->m_Config).ITTPerformanceTiming = false;
  (this->m_Config).ITTShowOnlyExecutingEvents = false;
  (this->m_Config).ChromePerformanceTiming = false;
  (this->m_Config).ChromePerformanceTimingInStages = false;
  (this->m_Config).ChromePerformanceTimingPerKernel = false;
  (this->m_Config).ChromePerformanceTimingEstimateQueuedTime = false;
  (this->m_Config).OmitProgramNumber = false;
  (this->m_Config).SimpleDumpProgramSource = false;
  (this->m_Config).DumpProgramSourceScript = false;
  (this->m_Config).DumpProgramSource = false;
  (this->m_Config).DumpInputProgramBinaries = false;
  (this->m_Config).DumpProgramBinaries = false;
  (this->m_Config).DumpInputProgramBinaries = false;
  (this->m_Config).DumpProgramBinaries = false;
  (this->m_Config).DumpProgramSPIRV = false;
  (this->m_Config).InjectProgramSource = false;
  (this->m_Config).InjectProgramBinaries = false;
  (this->m_Config).RejectProgramBinaries = false;
  (this->m_Config).InjectProgramSPIRV = false;
  (this->m_Config).PrependProgramSource = false;
  std::__cxx11::string::assign((char *)&(this->m_Config).AppendBuildOptions);
  std::__cxx11::string::assign((char *)&(this->m_Config).AppendLinkOptions);
  (this->m_Config).Emulate_cl_intel_unified_shared_memory = false;
  (this->m_Config).AutoCreateSPIRV = false;
  (this->m_Config).DumpProgramBuildLogs = false;
  (this->m_Config).DumpKernelISABinaries = false;
  (this->m_Config).Emulate_cl_khr_extended_versioning = false;
  (this->m_Config).Emulate_cl_khr_semaphore = false;
  std::__cxx11::string::assign((char *)&(this->m_Config).SPIRVClang);
  std::__cxx11::string::assign((char *)&(this->m_Config).SPIRVCLHeader);
  std::__cxx11::string::assign((char *)&(this->m_Config).SPIRVDis);
  std::__cxx11::string::assign((char *)&(this->m_Config).DefaultOptions);
  std::__cxx11::string::assign((char *)&(this->m_Config).OpenCL2Options);
  (this->m_Config).DumpBuffersBeforeEnqueue = false;
  (this->m_Config).DumpBuffersAfterEnqueue = false;
  (this->m_Config).OmitCommandBufferNumber = false;
  (this->m_Config).DumpCommandBuffers = false;
  (this->m_Config).DumpBufferHashes = false;
  (this->m_Config).DumpImageHashes = false;
  (this->m_Config).DumpArgumentsOnSet = false;
  (this->m_Config).DumpBuffersAfterCreate = false;
  (this->m_Config).DumpBuffersAfterMap = false;
  (this->m_Config).DumpBuffersBeforeUnmap = false;
  std::__cxx11::string::assign((char *)&(this->m_Config).DumpBuffersForKernel);
  (this->m_Config).DumpImagesBeforeEnqueue = false;
  (this->m_Config).DumpImagesAfterEnqueue = false;
  std::__cxx11::string::assign((char *)&(this->m_Config).DumpImagesForKernel);
  (this->m_Config).DumpBuffersMinEnqueue = 0;
  (this->m_Config).DumpBuffersMaxEnqueue = 0xffffffff;
  (this->m_Config).DumpImagesMinEnqueue = 0;
  (this->m_Config).DumpImagesMaxEnqueue = 0xffffffff;
  (this->m_Config).DumpArgumentsOnSetMinEnqueue = 0;
  (this->m_Config).DumpArgumentsOnSetMaxEnqueue = 0xffffffff;
  (this->m_Config).InjectBuffers = false;
  (this->m_Config).InjectImages = false;
  (this->m_Config).AutoPartitionAllDevices = false;
  (this->m_Config).AutoPartitionAllSubDevices = false;
  (this->m_Config).AutoPartitionSingleSubDevice = false;
  (this->m_Config).AutoPartitionByAffinityDomain = true;
  (this->m_Config).AutoPartitionEqually = 1;
  (this->m_Config).CaptureReplay = false;
  (this->m_Config).CaptureReplayMinEnqueue = 0;
  (this->m_Config).CaptureReplayMaxEnqueue = 0xffffffff;
  std::__cxx11::string::assign((char *)&(this->m_Config).CaptureReplayKernelName);
  (this->m_Config).CaptureReplayUniqueKernels = false;
  (this->m_Config).CaptureReplayNumKernelEnqueuesSkip = 0;
  (this->m_Config).CaptureReplayNumKernelEnqueuesCapture = 0xffffffff;
  (this->m_Config).AubCapture = false;
  (this->m_Config).AubCaptureKDC = false;
  (this->m_Config).AubCaptureIndividualEnqueues = false;
  (this->m_Config).AubCaptureMinEnqueue = 0;
  (this->m_Config).AubCaptureMaxEnqueue = 0xffffffff;
  std::__cxx11::string::assign((char *)&(this->m_Config).AubCaptureKernelName);
  std::__cxx11::string::assign((char *)&(this->m_Config).AubCaptureKernelGWS);
  std::__cxx11::string::assign((char *)&(this->m_Config).AubCaptureKernelLWS);
  (this->m_Config).AubCaptureUniqueKernels = false;
  (this->m_Config).AubCaptureNumKernelEnqueuesSkip = 0;
  (this->m_Config).AubCaptureNumKernelEnqueuesCapture = 0xffffffff;
  (this->m_Config).NoErrors = false;
  (this->m_Config).AubCaptureStartWait = 0;
  (this->m_Config).AubCaptureEndWait = 0;
  (this->m_Config).ExitOnEnqueueCount = 0;
  (this->m_Config).NullContextCallback = false;
  (this->m_Config).FinishAfterEnqueue = false;
  (this->m_Config).FlushAfterEnqueue = false;
  (this->m_Config).FlushAfterEnqueueBarrier = false;
  (this->m_Config).InOrderQueue = false;
  (this->m_Config).NoProfilingQueue = false;
  (this->m_Config).DummyOutOfOrderQueue = false;
  (this->m_Config).NullEnqueue = false;
  (this->m_Config).NullLocalWorkSize = false;
  (this->m_Config).NullLocalWorkSizeX = 0;
  (this->m_Config).NullLocalWorkSizeY = 0;
  *(undefined1 (*) [16])((long)&(this->m_Config).NullLocalWorkSizeY + 1) = (undefined1  [16])0x0;
  (this->m_Config).RelaxAllocationLimits = false;
  (this->m_Config).DefaultQueuePriorityHint = 0;
  (this->m_Config).DefaultQueueThrottleHint = 0;
  std::__cxx11::string::assign((char *)&(this->m_Config).PlatformName);
  std::__cxx11::string::assign((char *)&(this->m_Config).PlatformVendor);
  std::__cxx11::string::assign((char *)&(this->m_Config).PlatformProfile);
  std::__cxx11::string::assign((char *)&(this->m_Config).PlatformVersion);
  (this->m_Config).DeviceTypeFilter = 0xffffffff;
  (this->m_Config).DeviceType = 0;
  std::__cxx11::string::assign((char *)&(this->m_Config).DeviceName);
  std::__cxx11::string::assign((char *)&(this->m_Config).DeviceVendor);
  std::__cxx11::string::assign((char *)&(this->m_Config).DeviceProfile);
  std::__cxx11::string::assign((char *)&(this->m_Config).DeviceVersion);
  std::__cxx11::string::assign((char *)&(this->m_Config).DeviceCVersion);
  std::__cxx11::string::assign((char *)&(this->m_Config).DeviceExtensions);
  std::__cxx11::string::assign((char *)&(this->m_Config).DeviceILVersion);
  (this->m_Config).DeviceVendorID = 0;
  (this->m_Config).DeviceMaxComputeUnits = 0;
  (this->m_Config).DevicePreferredVectorWidthChar = 0xffffffff;
  (this->m_Config).DevicePreferredVectorWidthShort = 0xffffffff;
  (this->m_Config).DevicePreferredVectorWidthInt = 0xffffffff;
  (this->m_Config).DevicePreferredVectorWidthLong = 0xffffffff;
  (this->m_Config).DevicePreferredVectorWidthLong = 0xffffffff;
  (this->m_Config).DevicePreferredVectorWidthHalf = 0xffffffff;
  (this->m_Config).DevicePreferredVectorWidthFloat = 0xffffffff;
  (this->m_Config).DevicePreferredVectorWidthDouble = 0xffffffff;
  std::__cxx11::string::assign((char *)&(this->m_Config).DriverVersion);
  std::__cxx11::string::assign((char *)&(this->m_Config).PrependDeviceExtensions);
  (this->m_Config).ForceByteBufferOverrides = false;
  (this->m_Config).OverrideReadBuffer = false;
  (this->m_Config).OverrideWriteBuffer = false;
  (this->m_Config).OverrideCopyBuffer = false;
  (this->m_Config).OverrideReadImage = false;
  (this->m_Config).OverrideWriteImage = false;
  (this->m_Config).OverrideCopyImage = false;
  (this->m_Config).OverrideBuiltinKernels = false;
  return;
}

Assistant:

CLIntercept::CLIntercept( void* pGlobalData )
    : m_OS( pGlobalData )
{
    m_ProcessId = m_OS.GetProcessID();

    m_Dispatch = {0};
    m_DispatchX[NULL] = {0};

    m_OpenCLLibraryHandle = NULL;

    m_LoggedCLInfo = false;

    m_EnqueueCounter.store(0, std::memory_order::memory_order_relaxed);

    m_EventsChromeTraced = 0;
    m_ProgramNumber = 0;
    m_KernelID = 0;

#if defined(USE_MDAPI)
    m_pMDHelper = NULL;
#endif

    m_QueueNumber = 0;
    m_MemAllocNumber = 0;

    m_CaptureReplayKernelEnqueueSkipCounter = 0;
    m_CaptureReplayKernelEnqueueCaptureCounter = 0;

    m_AubCaptureStarted = false;
    m_AubCaptureKernelEnqueueSkipCounter = 0;
    m_AubCaptureKernelEnqueueCaptureCounter = 0;

    m_CommandBufferNumber = 0;

#define CLI_CONTROL( _type, _name, _init, _desc )   m_Config . _name = _init;
#include "controls.h"
#undef CLI_CONTROL

#if defined(USE_ITT)
    m_ITTInitialized = false;

    m_ITTDomain = NULL;

    //m_ITTQueuedState = NULL;
    //m_ITTSubmittedState = NULL;
    //m_ITTExecutingState = NULL;

    //m_ITTQueueTrackGroup = NULL;
#endif
}